

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall glslang::TIntermediate::setSpv(TIntermediate *this,SpvVersion *s)

{
  uint uVar1;
  int iVar2;
  SpvVersion *s_local;
  TIntermediate *this_local;
  
  iVar2 = s->vulkanGlsl;
  (this->spvVersion).spv = s->spv;
  (this->spvVersion).vulkanGlsl = iVar2;
  iVar2 = s->openGl;
  (this->spvVersion).vulkan = s->vulkan;
  (this->spvVersion).openGl = iVar2;
  (this->spvVersion).vulkanRelaxed = s->vulkanRelaxed;
  if (0 < (this->spvVersion).vulkan) {
    TProcesses::addProcess(&this->processes,"client vulkan100");
  }
  if (0 < (this->spvVersion).openGl) {
    TProcesses::addProcess(&this->processes,"client opengl100");
  }
  uVar1 = (this->spvVersion).spv;
  if ((uVar1 != 0) && (uVar1 != 0x10000)) {
    if (uVar1 == 0x10100) {
      TProcesses::addProcess(&this->processes,"target-env spirv1.1");
    }
    else if (uVar1 == 0x10200) {
      TProcesses::addProcess(&this->processes,"target-env spirv1.2");
    }
    else if (uVar1 == 0x10300) {
      TProcesses::addProcess(&this->processes,"target-env spirv1.3");
    }
    else if (uVar1 == 0x10400) {
      TProcesses::addProcess(&this->processes,"target-env spirv1.4");
    }
    else if (uVar1 == 0x10500) {
      TProcesses::addProcess(&this->processes,"target-env spirv1.5");
    }
    else if (uVar1 == 0x10600) {
      TProcesses::addProcess(&this->processes,"target-env spirv1.6");
    }
    else {
      TProcesses::addProcess(&this->processes,"target-env spirvUnknown");
    }
  }
  iVar2 = (this->spvVersion).vulkan;
  if (iVar2 != 0) {
    if (iVar2 == 0x400000) {
      TProcesses::addProcess(&this->processes,"target-env vulkan1.0");
    }
    else if (iVar2 == 0x401000) {
      TProcesses::addProcess(&this->processes,"target-env vulkan1.1");
    }
    else if (iVar2 == 0x402000) {
      TProcesses::addProcess(&this->processes,"target-env vulkan1.2");
    }
    else if (iVar2 == 0x403000) {
      TProcesses::addProcess(&this->processes,"target-env vulkan1.3");
    }
    else if (iVar2 == 0x404000) {
      TProcesses::addProcess(&this->processes,"target-env vulkan1.4");
    }
    else {
      TProcesses::addProcess(&this->processes,"target-env vulkanUnknown");
    }
  }
  if (0 < (this->spvVersion).openGl) {
    TProcesses::addProcess(&this->processes,"target-env opengl");
  }
  return;
}

Assistant:

void setSpv(const SpvVersion& s)
    {
        spvVersion = s;

        // client processes
        if (spvVersion.vulkan > 0)
            processes.addProcess("client vulkan100");
        if (spvVersion.openGl > 0)
            processes.addProcess("client opengl100");

        // target SPV
        switch (spvVersion.spv) {
        case 0:
            break;
        case EShTargetSpv_1_0:
            break;
        case EShTargetSpv_1_1:
            processes.addProcess("target-env spirv1.1");
            break;
        case EShTargetSpv_1_2:
            processes.addProcess("target-env spirv1.2");
            break;
        case EShTargetSpv_1_3:
            processes.addProcess("target-env spirv1.3");
            break;
        case EShTargetSpv_1_4:
            processes.addProcess("target-env spirv1.4");
            break;
        case EShTargetSpv_1_5:
            processes.addProcess("target-env spirv1.5");
            break;
        case EShTargetSpv_1_6:
            processes.addProcess("target-env spirv1.6");
            break;
        default:
            processes.addProcess("target-env spirvUnknown");
            break;
        }

        // target-environment processes
        switch (spvVersion.vulkan) {
        case 0:
            break;
        case EShTargetVulkan_1_0:
            processes.addProcess("target-env vulkan1.0");
            break;
        case EShTargetVulkan_1_1:
            processes.addProcess("target-env vulkan1.1");
            break;
        case EShTargetVulkan_1_2:
            processes.addProcess("target-env vulkan1.2");
            break;
        case EShTargetVulkan_1_3:
            processes.addProcess("target-env vulkan1.3");
            break;
        case EShTargetVulkan_1_4:
            processes.addProcess("target-env vulkan1.4");
            break;
        default:
            processes.addProcess("target-env vulkanUnknown");
            break;
        }
        if (spvVersion.openGl > 0)
            processes.addProcess("target-env opengl");
    }